

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

bool __thiscall
density::
conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
empty(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
      *this)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  int iVar3;
  ControlBlock *pCVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pCVar1 = (this->m_queue).m_tail;
  pCVar2 = (this->m_queue).m_head;
  do {
    pCVar4 = pCVar2;
    if (pCVar4 == pCVar1) break;
    pCVar2 = (ControlBlock *)(pCVar4->m_next & 0xfffffffffffffff8);
  } while ((pCVar4->m_next & 3) != 0);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return pCVar4 == pCVar1;
}

Assistant:

bool empty() const noexcept
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            return m_queue.empty();
        }